

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_column_data_ref.cpp
# Opt level: O1

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::Bind(Binder *this,ColumnDataRef *ref)

{
  _Head_base<0UL,_duckdb::BoundColumnDataRef_*,_false> _Var1;
  type pCVar2;
  idx_t iVar3;
  pointer pBVar4;
  long in_RDX;
  templated_unique_single_t result;
  vector<duckdb::LogicalType,_true> types;
  _Head_base<0UL,_duckdb::BoundColumnDataRef_*,_false> local_40;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_38;
  
  pCVar2 = shared_ptr<duckdb::ColumnDataCollection,_true>::operator*
                     ((shared_ptr<duckdb::ColumnDataCollection,_true> *)(in_RDX + 0x80));
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_38,
             &(pCVar2->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  local_40._M_head_impl = (BoundColumnDataRef *)operator_new(0x30);
  *(undefined1 *)
   &((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(((element_type *)local_40._M_head_impl)->super_enable_shared_from_this<duckdb::Binder>)
            .__weak_this_.internal + 8))->_M_pi = 0xb;
  ((element_type *)local_40._M_head_impl)->context = (ClientContext *)0x0;
  (((element_type *)local_40._M_head_impl)->CTE_bindings)._M_h._M_buckets = (__buckets_ptr)0x0;
  *(undefined ***)
   &(((element_type *)local_40._M_head_impl)->super_enable_shared_from_this<duckdb::Binder>).
    __weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2> =
       &PTR__BoundColumnDataRef_0248e3c0;
  (((element_type *)local_40._M_head_impl)->CTE_bindings)._M_h._M_bucket_count = (size_type)pCVar2;
  iVar3 = GenerateTableIndex((Binder *)ref);
  pBVar4 = unique_ptr<duckdb::BoundColumnDataRef,_std::default_delete<duckdb::BoundColumnDataRef>,_true>
           ::operator->((unique_ptr<duckdb::BoundColumnDataRef,_std::default_delete<duckdb::BoundColumnDataRef>,_true>
                         *)&local_40);
  pBVar4->bind_index = iVar3;
  pBVar4 = unique_ptr<duckdb::BoundColumnDataRef,_std::default_delete<duckdb::BoundColumnDataRef>,_true>
           ::operator->((unique_ptr<duckdb::BoundColumnDataRef,_std::default_delete<duckdb::BoundColumnDataRef>,_true>
                         *)&local_40);
  BindContext::AddGenericBinding
            ((BindContext *)
             &(ref->collection).internal.
              super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pBVar4->bind_index,(string *)(in_RDX + 0x10),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)(in_RDX + 0x68),(vector<duckdb::LogicalType,_true> *)&local_38);
  _Var1._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (BoundColumnDataRef *)0x0;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_head_impl;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_38);
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)this;
}

Assistant:

unique_ptr<BoundTableRef> Binder::Bind(ColumnDataRef &ref) {
	auto &collection = *ref.collection;
	auto types = collection.Types();
	auto result = make_uniq<BoundColumnDataRef>(collection);
	result->bind_index = GenerateTableIndex();
	bind_context.AddGenericBinding(result->bind_index, ref.alias, ref.expected_names, types);
	return unique_ptr_cast<BoundColumnDataRef, BoundTableRef>(std::move(result));
}